

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::addImageProcessing2QCOMDecoration
          (TGlslangToSpvTraverser *this,Id id,bool isForGather)

{
  Id id_00;
  undefined7 in_register_00000011;
  anon_class_8_1_8991fb9c addDecor;
  
  if ((int)CONCAT71(in_register_00000011,isForGather) != 0) {
    addImageProcessingQCOMDecoration(this,id,BlockMatchTextureQCOM);
    return;
  }
  addDecor.this = this;
  if ((this->builder).module.idToInstruction.
      super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
      super__Vector_impl_data._M_start[id]->opCode == OpSampledImage) {
    id_00 = spv::Builder::getIdOperand(&this->builder,id,0);
    addImageProcessing2QCOMDecoration::anon_class_8_1_8991fb9c::operator()
              (&addDecor,id_00,BlockMatchTextureQCOM);
    id = spv::Builder::getIdOperand(&this->builder,id,1);
  }
  else {
    addImageProcessing2QCOMDecoration::anon_class_8_1_8991fb9c::operator()
              (&addDecor,id,BlockMatchTextureQCOM);
  }
  addImageProcessing2QCOMDecoration::anon_class_8_1_8991fb9c::operator()
            (&addDecor,id,BlockMatchSamplerQCOM);
  return;
}

Assistant:

void TGlslangToSpvTraverser::addImageProcessing2QCOMDecoration(spv::Id id, bool isForGather)
{
  if (isForGather) {
    return addImageProcessingQCOMDecoration(id, spv::DecorationBlockMatchTextureQCOM);
  }

  auto addDecor =
    [this](spv::Id id, spv::Decoration decor) {
      spv::Id tsopc = this->builder.getOpCode(id);
      if (tsopc == spv::OpLoad) {
        spv::Id tsid = this->builder.getIdOperand(id, 0);
        if (this->glslangIntermediate->getSpv().spv >= glslang::EShTargetSpv_1_4) {
          assert(iOSet.count(tsid) > 0);
        }
        if (!hasQCOMImageProceessingDecoration(tsid, decor)) {
          this->builder.addDecoration(tsid, decor);
          idToQCOMDecorations[tsid].push_back(decor);
        }
      }
    };

  spv::Id opc = builder.getOpCode(id);
  bool isInterfaceObject = (opc != spv::OpSampledImage);

  if (!isInterfaceObject) {
    addDecor(builder.getIdOperand(id, 0), spv::DecorationBlockMatchTextureQCOM);
    addDecor(builder.getIdOperand(id, 1), spv::DecorationBlockMatchSamplerQCOM);
  } else {
    addDecor(id, spv::DecorationBlockMatchTextureQCOM);
    addDecor(id, spv::DecorationBlockMatchSamplerQCOM);
  }
}